

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Alias::compile
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Alias *this)

{
  uint scopeParameterCount;
  Impl *pIVar1;
  Node *resolver;
  uint64_t scopeId;
  ErrorReporter *errorReporter;
  Builder brandBuilder;
  StructReader expression;
  undefined1 *ptr;
  Arena *this_00;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_c8;
  Builder local_58;
  
  if (this->initialized == false) {
    this->initialized = true;
    pIVar1 = this->module->compiler;
    Orphanage::newOrphan<capnp::schema::Brand>
              ((Orphan<capnp::schema::Brand> *)&local_c8,&(pIVar1->workspace).orphanage);
    capnp::_::OrphanBuilder::operator=(&(this->brandOrphan).builder,(OrphanBuilder *)&local_c8);
    capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_c8);
    this_00 = &(pIVar1->workspace).arena;
    local_c8.ptr.isSet = true;
    local_c8.ptr.field_1._0_8_ = this;
    ptr = (undefined1 *)kj::Arena::allocateBytes(this_00,0x10,8,true);
    *ptr = 1;
    *(Alias **)(ptr + 8) = this;
    local_c8.ptr.isSet = false;
    kj::Arena::setDestructor
              (this_00,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:368:36)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:368:36)>
                 *)&local_c8);
    resolver = this->parent;
    scopeId = resolver->id;
    scopeParameterCount = resolver->genericParamCount;
    errorReporter = &this->module->parserModule->super_ErrorReporter;
    expression = (this->targetName)._reader;
    capnp::_::OrphanGetImpl<capnp::schema::Brand,_(capnp::Kind)3>::apply
              (&local_58,&(this->brandOrphan).builder);
    brandBuilder._builder.capTable = local_58._builder.capTable;
    brandBuilder._builder.segment = local_58._builder.segment;
    brandBuilder._builder.data = local_58._builder.data;
    brandBuilder._builder.pointers = local_58._builder.pointers;
    brandBuilder._builder.dataSize = local_58._builder.dataSize;
    brandBuilder._builder.pointerCount = local_58._builder.pointerCount;
    brandBuilder._builder._38_2_ = local_58._builder._38_2_;
    NodeTranslator::compileDecl
              (&local_c8,scopeId,scopeParameterCount,&resolver->super_Resolver,errorReporter,
               (Reader)expression,brandBuilder);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::operator=(&this->target,&local_c8);
  }
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::NullableValue(&__return_storage_ptr__->ptr,&(this->target).ptr);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult> Compiler::Alias::compile() {
  if (!initialized) {
    initialized = true;

    auto& workspace = module.getCompiler().getWorkspace();
    brandOrphan = workspace.orphanage.newOrphan<schema::Brand>();

    // If the Workspace is destroyed, revert the alias to the uninitialized state, because the
    // orphan we created is no longer valid in this case.
    workspace.arena.copy(kj::defer([this]() {
      initialized = false;
      brandOrphan = Orphan<schema::Brand>();
    }));

    target = NodeTranslator::compileDecl(
        parent.getId(), parent.getParameterCount(), parent,
        module.getErrorReporter(), targetName, brandOrphan.get());
  }

  return target;
}